

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGCachePolicy.cpp
# Opt level: O2

MEMORY_OBJECT_CONTROL_STATE __thiscall
GmmLib::GmmXe_LPGCachePolicy::CachePolicyGetMemoryObject
          (GmmXe_LPGCachePolicy *this,GMM_RESOURCE_INFO *pResInfo,GMM_RESOURCE_USAGE_TYPE Usage)

{
  GMM_CACHE_POLICY_ELEMENT *pGVar1;
  MEMORY_OBJECT_CONTROL_STATE *pMVar2;
  
  if (pResInfo == (GMM_RESOURCE_INFO *)0x0) {
    pGVar1 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
  }
  else {
    (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])(pResInfo);
    pGVar1 = (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
             super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
             pCachePolicy;
    if ((pGVar1[Usage].Override != 0xffffffff) &&
       ((pGVar1[Usage].Override & pGVar1[Usage].IDCode) == 0)) {
      pMVar2 = (MEMORY_OBJECT_CONTROL_STATE *)&pGVar1[Usage].field_3;
      goto LAB_0016b92d;
    }
  }
  pMVar2 = &pGVar1[Usage].MemoryObjectOverride;
LAB_0016b92d:
  return (MEMORY_OBJECT_CONTROL_STATE)(*pMVar2).DwordValue;
}

Assistant:

MEMORY_OBJECT_CONTROL_STATE GMM_STDCALL GmmLib::GmmXe_LPGCachePolicy::CachePolicyGetMemoryObject(GMM_RESOURCE_INFO *pResInfo, GMM_RESOURCE_USAGE_TYPE Usage)
{
    __GMM_ASSERT(pCachePolicy[Usage].Initialized);

    // Prevent wrong Usage for XAdapter resources. UMD does not call GetMemoryObject on shader resources but,
    // when they add it someone could call it without knowing the restriction.
    if (pResInfo &&
        pResInfo->GetResFlags().Info.XAdapter &&
         (Usage != GMM_RESOURCE_USAGE_XADAPTER_SHARED_RESOURCE))
    {
        __GMM_ASSERT(false);
    }

    if (!pResInfo ||
        (pCachePolicy[Usage].Override & pCachePolicy[Usage].IDCode) ||
        (pCachePolicy[Usage].Override == ALWAYS_OVERRIDE))
    {
        return pCachePolicy[Usage].MemoryObjectOverride;
    }
    else
    {
        return pCachePolicy[Usage].MemoryObjectNoOverride;
    }
}